

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

uint __thiscall Assimp::XGLImporter::ResolveMaterialRef(XGLImporter *this,TempScope *scope)

{
  pointer ppaVar1;
  bool bVar2;
  iterator iVar3;
  uint uVar4;
  allocator local_59;
  string local_58;
  string local_38;
  
  GetElementName_abi_cxx11_(&local_38,this);
  bVar2 = std::operator==(&local_38,"mat");
  if (bVar2) {
    ReadMaterial(this,scope);
    uVar4 = (int)((ulong)((long)(scope->materials_linear).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(scope->materials_linear).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  }
  else {
    local_58._M_dataplus._M_p._0_4_ = ReadIndexFromText(this);
    iVar3 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMaterial_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMaterial_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
            ::find(&(scope->materials)._M_t,(key_type *)&local_58);
    if ((_Rb_tree_header *)iVar3._M_node == &(scope->materials)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::string((string *)&local_58,"<matref> index out of range",&local_59);
      LogFunctions<Assimp::XGLImporter>::ThrowException(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    ppaVar1 = (scope->materials_linear).
              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = 0;
    while( true ) {
      if ((uint)((ulong)((long)(scope->materials_linear).
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar1) >> 3) ==
          uVar4) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/XGL/XGLLoader.cpp"
                      ,0x2d9,"unsigned int Assimp::XGLImporter::ResolveMaterialRef(TempScope &)");
      }
      if ((_Base_ptr)ppaVar1[uVar4] == iVar3._M_node[1]._M_parent) break;
      uVar4 = uVar4 + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return uVar4;
}

Assistant:

unsigned int XGLImporter::ResolveMaterialRef(TempScope& scope)
{
    const std::string& s = GetElementName();
    if (s == "mat") {
        ReadMaterial(scope);
        return static_cast<unsigned int>(scope.materials_linear.size()-1);
    }

    const int id = ReadIndexFromText();

    std::map<unsigned int, aiMaterial*>::iterator it = scope.materials.find(id), end = scope.materials.end();
    if (it == end) {
        ThrowException("<matref> index out of range");
    }

    // ok, this is n^2 and should get optimized one day
    aiMaterial* const m = (*it).second;

    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.materials_linear.size());
    for(; i < mcount; ++i) {
        if (scope.materials_linear[i] == m) {
            return i;
        }
    }

    ai_assert(false);
    return 0;
}